

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  pointer pAVar1;
  AssertionStats *stats;
  AssertionOrBenchmarkResult *assertionOrBenchmark;
  pointer this_00;
  
  pAVar1 = (sectionNode->assertionsAndBenchmarks).
           super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (sectionNode->assertionsAndBenchmarks).
                 super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pAVar1; this_00 = this_00 + 1
      ) {
    if ((this_00->m_assertion).nullableValue != (AssertionStats *)0x0) {
      stats = Detail::AssertionOrBenchmarkResult::asAssertion(this_00);
      writeAssertion(this,stats);
    }
  }
  return;
}

Assistant:

void JunitReporter::writeAssertions( SectionNode const& sectionNode ) {
        for (auto const& assertionOrBenchmark : sectionNode.assertionsAndBenchmarks) {
            if (assertionOrBenchmark.isAssertion()) {
                writeAssertion(assertionOrBenchmark.asAssertion());
            }
        }
    }